

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
avro::toBin(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *s)

{
  pointer puVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,s->_M_string_length);
  if (0 < (long)s->_M_string_length) {
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (s->_M_dataplus)._M_p;
    lVar3 = s->_M_string_length + 1;
    lVar4 = 0;
    do {
      puVar1[lVar4] = pcVar2[lVar4];
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + 1;
    } while (1 < lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<uint8_t> toBin(const std::string& s)
{
    vector<uint8_t> result;
    result.resize(s.size());
    std::copy(s.c_str(), s.c_str() + s.size(), &result[0]);
    return result;
}